

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyorigin.h
# Opt level: O0

bool operator<(KeyOriginInfo *a,KeyOriginInfo *b)

{
  long lVar1;
  __synth3way_t<unsigned_int> _Var2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  void *in_RDI;
  long in_FS_OFFSET;
  int fpr_cmp;
  __unspec *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined1 local_a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = memcmp(in_RDI,in_RSI,4);
  if (iVar3 < 0) {
    local_a = true;
  }
  else if (iVar3 < 1) {
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_ffffffffffffffb8);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_ffffffffffffffb8);
    if (sVar4 < sVar5) {
      local_a = true;
    }
    else {
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         in_stack_ffffffffffffffb8);
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         in_stack_ffffffffffffffb8);
      if (sVar5 < sVar4) {
        local_a = false;
      }
      else {
        _Var2 = std::operator<=><unsigned_int,std::allocator<unsigned_int>>
                          (in_RSI,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  CONCAT44(iVar3,in_stack_ffffffffffffffd8));
        std::__cmp_cat::__unspec::__unspec(in_stack_ffffffffffffffb8,(__unspec *)0x695551);
        local_a = std::operator<(_Var2._M_value);
      }
    }
  }
  else {
    local_a = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_a;
  }
  __stack_chk_fail();
}

Assistant:

bool operator<(const KeyOriginInfo& a, const KeyOriginInfo& b)
    {
        // Compare the fingerprints lexicographically
        int fpr_cmp = memcmp(a.fingerprint, b.fingerprint, 4);
        if (fpr_cmp < 0) {
            return true;
        } else if (fpr_cmp > 0) {
            return false;
        }
        // Compare the sizes of the paths, shorter is "less than"
        if (a.path.size() < b.path.size()) {
            return true;
        } else if (a.path.size() > b.path.size()) {
            return false;
        }
        // Paths same length, compare them lexicographically
        return a.path < b.path;
    }